

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O1

bool anon_unknown.dwarf_f2a380::HandleWriteImpl
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,bool append,cmExecutionStatus *status)

{
  pointer pbVar1;
  pointer pcVar2;
  undefined1 auVar3 [16];
  undefined1 *puVar4;
  bool bVar5;
  string *psVar6;
  Status SVar7;
  long *plVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **ppbVar9;
  _Ios_Openmode _Var10;
  byte bVar11;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_00;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_01;
  mode_t mode;
  string fileName;
  string error_1;
  string message;
  string dir;
  ofstream file;
  mode_t local_334;
  string local_330;
  undefined1 local_310 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2e0;
  string local_2d0;
  pointer local_2b0;
  pointer local_2a8;
  undefined1 local_2a0 [16];
  undefined1 local_290 [16];
  undefined8 *local_280;
  pointer local_278;
  pointer local_270;
  pointer *local_268;
  undefined8 local_260;
  char *local_258;
  undefined8 local_250;
  size_type local_248;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_240;
  undefined8 local_238;
  undefined1 local_230 [8];
  pointer local_228;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_220;
  long lStack_218;
  undefined8 *local_210;
  undefined8 local_208;
  size_type local_200;
  pointer local_1f8;
  undefined8 local_1f0;
  ios_base local_138 [264];
  
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pcVar2 = pbVar1[1]._M_dataplus._M_p;
  local_330._M_dataplus._M_p = (pointer)&local_330.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_330,pcVar2,pcVar2 + pbVar1[1]._M_string_length);
  bVar5 = cmsys::SystemTools::FileIsFullPath(pbVar1 + 1);
  if (!bVar5) {
    psVar6 = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_(status->Makefile);
    local_228 = (psVar6->_M_dataplus)._M_p;
    local_230 = (undefined1  [8])psVar6->_M_string_length;
    local_220 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_280 = (undefined8 *)(local_290 + 0x18);
    local_290._0_8_ = (undefined1 *)0x0;
    local_290._8_8_ = &DAT_00000001;
    local_278 = (pointer)CONCAT71(local_278._1_7_,0x2f);
    lStack_218 = 1;
    local_208 = 0;
    local_1f8 = pbVar1[1]._M_dataplus._M_p;
    local_200 = pbVar1[1]._M_string_length;
    local_1f0 = 0;
    views._M_len = 3;
    views._M_array = (iterator)local_230;
    local_210 = local_280;
    cmCatViews(&local_2d0,views);
    std::__cxx11::string::operator=((string *)&local_330,(string *)&local_2d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
      operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1);
    }
  }
  bVar5 = cmMakefile::CanIWriteThisFile(status->Makefile,&local_330);
  if (bVar5) {
    cmsys::SystemTools::GetFilenamePath(&local_2d0,&local_330);
    cmsys::SystemTools::MakeDirectory(&local_2d0,(mode_t *)0x0);
    local_334 = 0;
    SVar7 = cmsys::SystemTools::GetPermissions(&local_330,&local_334);
    if (SVar7.Kind_ == Success) {
      if ((char)(byte)local_334 < '\0') {
        bVar11 = (byte)local_334 >> 7;
      }
      else {
        bVar11 = 0;
        cmsys::SystemTools::SetPermissions(&local_330,local_334 | 0x90,false);
      }
    }
    else {
      bVar11 = 0;
    }
    _Var10 = _S_out;
    if (append) {
      _Var10 = _S_app;
    }
    std::ofstream::ofstream(local_230,local_330._M_dataplus._M_p,_Var10);
    if ((*(byte *)((long)&local_210 + (long)*(_func_int **)((long)local_230 + -0x18)) & 5) == 0) {
      local_310._0_8_ = pbVar1 + 2;
      local_310._8_8_ =
           (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
      puVar4 = local_290 + 0x10;
      local_290._8_8_ = (char *)0x0;
      local_280 = (undefined8 *)((ulong)local_280 & 0xffffffffffffff00);
      auVar3._8_8_ = 0;
      auVar3._0_8_ = puVar4;
      local_290._0_8_ = puVar4;
      cmJoin((string *)&local_2f0,(cmStringRange *)local_310,(string_view)(auVar3 << 0x40),
             (string_view)ZEXT816(0));
      if ((undefined1 *)local_290._0_8_ != puVar4) {
        operator_delete((void *)local_290._0_8_,(ulong)((long)local_280 + 1));
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_230,(char *)local_2f0._M_allocated_capacity,local_2f0._8_8_);
      bVar5 = (*(byte *)((long)&local_210 + (long)*(_func_int **)((long)local_230 + -0x18)) & 5) ==
              0;
      if (bVar5) {
        std::ofstream::close();
        if (bVar11 == 0 && local_334 != 0) {
          cmsys::SystemTools::SetPermissions(&local_330,local_334,false);
        }
      }
      else {
        cmsys::SystemTools::GetLastSystemError_abi_cxx11_();
        local_290._0_8_ = (undefined1 *)0xe;
        local_290._8_8_ = "write failed (";
        local_280 = (undefined8 *)0x0;
        local_278 = local_2a8;
        local_270 = local_2b0;
        local_260 = 5;
        local_258 = "):\n  ";
        local_250 = 0;
        local_248 = local_330._M_string_length;
        local_240 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_330._M_dataplus._M_p;
        local_238 = 0;
        views_01._M_len = 4;
        views_01._M_array = (iterator)(local_2a0 + 0x10);
        local_268 = &local_2b0;
        cmCatViews((string *)local_310,views_01);
        if (local_2b0 != (pointer)local_2a0) {
          operator_delete(local_2b0,(ulong)(local_2a0._0_8_ + 1));
        }
        std::__cxx11::string::_M_assign((string *)&status->Error);
        if ((pointer)local_310._0_8_ != (pointer)(local_310 + 0x10)) {
          operator_delete((void *)local_310._0_8_,local_310._16_8_ + 1);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2f0._M_allocated_capacity != &local_2e0) {
        operator_delete((void *)local_2f0._M_allocated_capacity,local_2e0._M_allocated_capacity + 1)
        ;
      }
    }
    else {
      cmsys::SystemTools::GetLastSystemError_abi_cxx11_();
      local_290._0_8_ = (undefined1 *)0x1c;
      local_290._8_8_ = "failed to open for writing (";
      local_280 = (undefined8 *)0x0;
      local_278 = (pointer)local_310._8_8_;
      local_270 = (pointer)local_310._0_8_;
      local_260 = 5;
      local_258 = "):\n  ";
      local_250 = 0;
      local_248 = local_330._M_string_length;
      local_240 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_330._M_dataplus._M_p;
      local_238 = 0;
      views_00._M_len = 4;
      views_00._M_array = (iterator)(local_2a0 + 0x10);
      local_268 = (pointer *)local_310;
      cmCatViews((string *)&local_2f0,views_00);
      if ((pointer)local_310._0_8_ != (pointer)(local_310 + 0x10)) {
        operator_delete((void *)local_310._0_8_,local_310._16_8_ + 1);
      }
      std::__cxx11::string::_M_assign((string *)&status->Error);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2f0._M_allocated_capacity != &local_2e0) {
        operator_delete((void *)local_2f0._M_allocated_capacity,local_2e0._M_allocated_capacity + 1)
        ;
      }
      bVar5 = false;
    }
    local_230 = (undefined1  [8])_VTT;
    *(undefined8 *)(local_230 + (long)_VTT[-3]) = _EVP_PKEY_get_bn_param;
    std::filebuf::~filebuf((filebuf *)&local_228);
    std::ios_base::~ios_base(local_138);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
      operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_2a0 + 0x10),"attempted to write a file: ",&local_330);
    plVar8 = (long *)std::__cxx11::string::append(local_2a0 + 0x10);
    ppbVar9 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)(plVar8 + 2);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)*plVar8 == ppbVar9) {
      local_220 = *ppbVar9;
      lStack_218 = plVar8[3];
      local_230 = (undefined1  [8])&local_220;
    }
    else {
      local_220 = *ppbVar9;
      local_230 = (undefined1  [8])*plVar8;
    }
    local_228 = (pointer)plVar8[1];
    *plVar8 = (long)ppbVar9;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    if ((undefined1 *)local_290._0_8_ != local_290 + 0x10) {
      operator_delete((void *)local_290._0_8_,(ulong)((long)local_280 + 1));
    }
    std::__cxx11::string::_M_assign((string *)&status->Error);
    cmSystemTools::s_FatalErrorOccurred = true;
    if (local_230 != (undefined1  [8])&local_220) {
      operator_delete((void *)local_230,(ulong)((long)&(local_220->_M_dataplus)._M_p + 1));
    }
    bVar5 = false;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_330._M_dataplus._M_p != &local_330.field_2) {
    operator_delete(local_330._M_dataplus._M_p,local_330.field_2._M_allocated_capacity + 1);
  }
  return bVar5;
}

Assistant:

bool HandleWriteImpl(std::vector<std::string> const& args, bool append,
                     cmExecutionStatus& status)
{
  auto i = args.begin();

  i++; // Get rid of subcommand

  std::string fileName = *i;
  if (!cmsys::SystemTools::FileIsFullPath(*i)) {
    fileName =
      cmStrCat(status.GetMakefile().GetCurrentSourceDirectory(), '/', *i);
  }

  i++;

  if (!status.GetMakefile().CanIWriteThisFile(fileName)) {
    std::string e =
      "attempted to write a file: " + fileName + " into a source directory.";
    status.SetError(e);
    cmSystemTools::SetFatalErrorOccurred();
    return false;
  }
  std::string dir = cmSystemTools::GetFilenamePath(fileName);
  cmSystemTools::MakeDirectory(dir);

  mode_t mode = 0;
  bool writable = false;

  // Set permissions to writable
  if (cmSystemTools::GetPermissions(fileName, mode)) {
#if defined(_MSC_VER) || defined(__MINGW32__)
    writable = (mode & S_IWRITE) != 0;
    mode_t newMode = mode | S_IWRITE;
#else
    writable = mode & S_IWUSR;
    mode_t newMode = mode | S_IWUSR | S_IWGRP;
#endif
    if (!writable) {
      cmSystemTools::SetPermissions(fileName, newMode);
    }
  }
  // If GetPermissions fails, pretend like it is ok. File open will fail if
  // the file is not writable
  cmsys::ofstream file(fileName.c_str(),
                       append ? std::ios::app : std::ios::out);
  if (!file) {
    std::string error =
      cmStrCat("failed to open for writing (",
               cmSystemTools::GetLastSystemError(), "):\n  ", fileName);
    status.SetError(error);
    return false;
  }
  std::string message = cmJoin(cmMakeRange(i, args.end()), std::string());
  file << message;
  if (!file) {
    std::string error =
      cmStrCat("write failed (", cmSystemTools::GetLastSystemError(), "):\n  ",
               fileName);
    status.SetError(error);
    return false;
  }
  file.close();
  if (mode && !writable) {
    cmSystemTools::SetPermissions(fileName, mode);
  }
  return true;
}